

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Wait(MPIABI_Request *request,MPIABI_Status *status)

{
  int iVar1;
  ompi_request_t **ppoVar2;
  MPI_Status *pMVar3;
  WPI_StatusPtr local_38 [3];
  WPI_HandlePtr<ompi_request_t_*> local_20;
  MPIABI_Status *local_18;
  MPIABI_Status *status_local;
  MPIABI_Request *request_local;
  
  local_18 = status;
  status_local = (MPIABI_Status *)request;
  WPI_HandlePtr<ompi_request_t_*>::WPI_HandlePtr(&local_20,request);
  ppoVar2 = WPI_HandlePtr::operator_cast_to_ompi_request_t__((WPI_HandlePtr *)&local_20);
  WPI_StatusPtr::WPI_StatusPtr(local_38,local_18);
  pMVar3 = WPI_StatusPtr::operator_cast_to_ompi_status_public_t_(local_38);
  iVar1 = MPI_Wait(ppoVar2,pMVar3);
  WPI_StatusPtr::~WPI_StatusPtr(local_38);
  WPI_HandlePtr<ompi_request_t_*>::~WPI_HandlePtr(&local_20);
  return iVar1;
}

Assistant:

int MPIABI_Wait(
  MPIABI_Request * request,
  MPIABI_Status * status
) {
  return MPI_Wait(
    (MPI_Request *)(WPI_RequestPtr)request,
    (MPI_Status *)(WPI_StatusPtr)status
  );
}